

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.cpp
# Opt level: O2

void P_WriteACSDefereds(FILE *file)

{
  int *piVar1;
  uint uVar2;
  FPNGChunkArchive *this;
  FArchive *arc;
  ulong uVar3;
  long lVar4;
  FString empty;
  FString FStack_38;
  
  lVar4 = 0x98;
  this = (FPNGChunkArchive *)0x0;
  uVar2 = wadlevelinfos.Count;
  for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 1) {
    if (*(long *)((long)&(wadlevelinfos.Array)->levelnum + lVar4) != 0) {
      if (this == (FPNGChunkArchive *)0x0) {
        this = (FPNGChunkArchive *)operator_new(0x300);
        FPNGChunkArchive::FPNGChunkArchive(this,file,0x64536361);
      }
      piVar1 = &(wadlevelinfos.Array)->levelnum;
      arc = FArchive::operator<<
                      (&this->super_FArchive,(FString *)((long)wadlevelinfos.Array + lVar4 + -0x90))
      ;
      operator<<(arc,(acsdefered_t **)((long)piVar1 + lVar4));
      uVar2 = wadlevelinfos.Count;
    }
    lVar4 = lVar4 + 0x1b0;
  }
  if (this != (FPNGChunkArchive *)0x0) {
    FString::FString(&FStack_38,(char *)"");
    FArchive::operator<<(&this->super_FArchive,&FStack_38);
    (*(this->super_FArchive)._vptr_FArchive[1])(this);
    FString::~FString(&FStack_38);
  }
  return;
}

Assistant:

void P_WriteACSDefereds (FILE *file)
{
	FPNGChunkArchive *arc = NULL;

	for (unsigned int i = 0; i < wadlevelinfos.Size(); i++)
	{
		if (wadlevelinfos[i].defered)
		{
			if (arc == NULL)
			{
				arc = new FPNGChunkArchive (file, ACSD_ID);
			}
			writeDefereds (*arc, (level_info_t *)&wadlevelinfos[i]);
		}
	}

	if (arc != NULL)
	{
		// Signal end of defereds
		FString empty = "";
		(*arc) << empty;
		delete arc;
	}
}